

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall
QTableWidget::setCurrentItem(QTableWidget *this,QTableWidgetItem *item,SelectionFlags command)

{
  QItemSelectionModel *pQVar1;
  QTableModel *__s;
  undefined4 in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QTableWidgetPrivate *d;
  undefined4 local_c;
  QTableWidgetItem **local_8;
  
  local_8 = *(QTableWidgetItem ***)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  d_func((QTableWidget *)0x8dafee);
  pQVar1 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8db004);
  __s = QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8db012);
  QTableModel::index((QTableModel *)&stack0xffffffffffffffd8,(char *)__s,in_ESI);
  (**(code **)(*(long *)pQVar1 + 0x60))(pQVar1,(QTableModel *)&stack0xffffffffffffffd8,local_c);
  if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setCurrentItem(QTableWidgetItem *item, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTableWidget);
    d->selectionModel->setCurrentIndex(d->tableModel()->index(item), command);
}